

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::push_clip(Fl_Graphics_Driver *this,int x,int y,int w,int h)

{
  Fl_Region p_Var1;
  Fl_Region p_Var2;
  int iVar3;
  Fl_Region temp;
  Fl_Region current;
  Fl_Region r;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  if ((w < 1) || (h < 1)) {
    current = (Fl_Region)XCreateRegion();
  }
  else {
    p_Var2 = XRectangleRegion(x,y,w,h);
    p_Var1 = this->rstack[this->rstackptr];
    current = p_Var2;
    if (p_Var1 != (Fl_Region)0x0) {
      current = (Fl_Region)XCreateRegion();
      XIntersectRegion(p_Var1,p_Var2,current);
      XDestroyRegion(p_Var2);
    }
  }
  if (this->rstackptr < 9) {
    iVar3 = this->rstackptr + 1;
    this->rstackptr = iVar3;
    this->rstack[iVar3] = current;
  }
  else {
    (*Fl::warning)("fl_push_clip: clip stack overflow!\n");
  }
  fl_restore_clip();
  return;
}

Assistant:

void Fl_Graphics_Driver::push_clip(int x, int y, int w, int h) {
  Fl_Region r;
  if (w > 0 && h > 0) {
    r = XRectangleRegion(x,y,w,h);
    Fl_Region current = rstack[rstackptr];
    if (current) {
#if defined(USE_X11)
      Fl_Region temp = XCreateRegion();
      XIntersectRegion(current, r, temp);
      XDestroyRegion(r);
      r = temp;
#elif defined(WIN32)
      CombineRgn(r,r,current,RGN_AND);
#elif defined(__APPLE_QUARTZ__)
      XDestroyRegion(r);
      r = Fl_X::intersect_region_and_rect(current, x,y,w,h);
#else
# error unsupported platform
#endif
    }
  } else { // make empty clip region:
#if defined(USE_X11)
    r = XCreateRegion();
#elif defined(WIN32)
    r = CreateRectRgn(0,0,0,0);
#elif defined(__APPLE_QUARTZ__)
    r = XRectangleRegion(0,0,0,0);
#else
# error unsupported platform
#endif
  }
  if (rstackptr < region_stack_max) rstack[++rstackptr] = r;
  else Fl::warning("fl_push_clip: clip stack overflow!\n");
  fl_restore_clip();
}